

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_expression.cc
# Opt level: O2

shared_ptr<const_tchecker::typed_lvalue_expression_t> __thiscall
tchecker::typed_diagonal_clkconstr_expression_t::second_clock_ptr
          (typed_diagonal_clkconstr_expression_t *this)

{
  typed_expression_t *ptVar1;
  long lVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  typed_binary_expression_t *in_RSI;
  shared_ptr<const_tchecker::typed_lvalue_expression_t> sVar3;
  shared_ptr<const_tchecker::expression_t> local_20;
  
  ptVar1 = typed_binary_expression_t::left_operand(in_RSI);
  lVar2 = __dynamic_cast(ptVar1,&typed_expression_t::typeinfo,&typed_binary_expression_t::typeinfo,0
                        );
  if (lVar2 != 0) {
    std::dynamic_pointer_cast<tchecker::typed_expression_t_const,tchecker::expression_t_const>
              (&local_20);
    std::
    dynamic_pointer_cast<tchecker::typed_lvalue_expression_t_const,tchecker::typed_expression_t_const>
              ((shared_ptr<const_tchecker::typed_expression_t> *)this);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_20.
                super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    sVar3.super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    sVar3.super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)this;
    return (shared_ptr<const_tchecker::typed_lvalue_expression_t>)
           sVar3.
           super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  __cxa_bad_cast();
}

Assistant:

std::shared_ptr<tchecker::typed_lvalue_expression_t const> typed_diagonal_clkconstr_expression_t::second_clock_ptr() const
{
  auto const & diagonal = dynamic_cast<tchecker::typed_binary_expression_t const &>(left_operand()); // left expr is x - y
  return std::dynamic_pointer_cast<tchecker::typed_lvalue_expression_t const>(diagonal.right_operand_ptr());
}